

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test7::buildTestProgram(GPUShaderFP64Test7 *this,_variables *variables)

{
  GLint GVar1;
  code *pcVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  long lVar9;
  size_t sVar10;
  ios_base *this_00;
  GLint link_status;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  stringstream attribute_name_sstream;
  int local_414;
  long local_410;
  pointer local_408;
  long local_400;
  long *local_3f8;
  long local_3e8 [2];
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  undefined1 local_338 [16];
  undefined1 local_328 [112];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar8;
  
  getFragmentShaderBody_abi_cxx11_(&local_358,this,variables);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  getGeometryShaderBody_abi_cxx11_(&local_378,this,variables);
  getTessellationControlShaderBody_abi_cxx11_(&local_398,this,variables);
  getTessellationEvaluationShaderBody_abi_cxx11_(&local_3b8,this,variables);
  getVertexShaderBody_abi_cxx11_(&local_3d8,this,variables);
  local_414 = 0;
  bVar4 = compileShader(this,this->m_fs_id,&local_358);
  if (bVar4) {
    bVar4 = compileShader(this,this->m_gs_id,&local_378);
    if (bVar4) {
      bVar4 = compileShader(this,this->m_tc_id,&local_398);
      if (bVar4) {
        bVar4 = compileShader(this,this->m_te_id,&local_3b8);
        if (bVar4) {
          bVar4 = compileShader(this,this->m_vs_id,&local_3d8);
          if (bVar4) {
            releaseXFBVaryingNames(this);
            generateXFBVaryingNames(this,variables);
            (**(code **)(lVar8 + 0x14c8))
                      (this->m_po_id,this->m_n_xfb_varyings,this->m_xfb_varyings,0x8c8c);
            (**(code **)(lVar8 + 0xce8))(this->m_po_id);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,
                            "Either glTransformFeedbackVaryings() or glLinkProgram() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x22f1);
            (**(code **)(lVar8 + 0x9d8))(this->m_po_id,0x8b82,&local_414);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"glGetProgramiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x22f4);
            if (local_414 == 1) {
              if ((this->m_are_double_inputs_supported == true) &&
                 (lVar9 = (long)(variables->
                                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(variables->
                                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                )._M_impl.super__Vector_impl_data._M_start, lVar9 != 0)) {
                local_400 = (lVar9 >> 2) * -0x5555555555555555;
                local_400 = local_400 + (ulong)(local_400 == 0);
                lVar9 = 0;
                local_410 = 0;
                do {
                  local_408 = (variables->
                              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                  std::__cxx11::stringstream::stringstream((stringstream *)local_338);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_328,"in_vs_variable",0xe);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
                  if (1 < *(uint *)((long)&local_408->array_size + lVar9)) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"[0]",3)
                    ;
                  }
                  pcVar2 = *(code **)(lVar8 + 0x780);
                  GVar1 = this->m_po_id;
                  std::__cxx11::stringbuf::str();
                  uVar7 = (*pcVar2)(GVar1,local_1b0);
                  *(undefined4 *)((long)&local_408->attribute_location + lVar9) = uVar7;
                  if (local_1b0 != (undefined1  [8])local_1a0) {
                    operator_delete((void *)local_1b0,
                                    (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
                  }
                  if (*(int *)((long)&local_408->attribute_location + lVar9) == -1) {
                    local_1b0 = (undefined1  [8])
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                                m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_1a8,"Input double-precision attribute named [",0x28
                              );
                    std::__cxx11::stringbuf::str();
                    plVar3 = local_3f8;
                    if (local_3f8 == (long *)0x0) {
                      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
                    }
                    else {
                      sVar10 = strlen((char *)local_3f8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1a8,(char *)plVar3,sVar10);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_1a8,"] is considered inactive which is invalid.",
                               0x2a);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if (local_3f8 != local_3e8) {
                      operator_delete(local_3f8,local_3e8[0] + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                    std::ios_base::~ios_base(local_138);
                    this->m_has_test_passed = false;
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
                    this_00 = local_2b8;
                    goto LAB_0093319d;
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
                  std::ios_base::~ios_base(local_2b8);
                  local_410 = local_410 + 1;
                  lVar9 = lVar9 + 0xc;
                } while (local_400 != local_410);
              }
              std::__cxx11::string::_M_assign((string *)&this->m_current_fs_body);
              std::__cxx11::string::_M_assign((string *)&this->m_current_gs_body);
              std::__cxx11::string::_M_assign((string *)&this->m_current_tc_body);
              std::__cxx11::string::_M_assign((string *)&this->m_current_te_body);
              bVar4 = true;
              std::__cxx11::string::_M_assign((string *)&this->m_current_vs_body);
              goto LAB_009331a4;
            }
            local_338._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_338 + 8),"A valid program object failed to link.",0x26);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            local_338._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_338 + 8),"Vertex shader failed to compile.",0x20);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        else {
          local_338._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_338 + 8),"Tessellation evaluation shader failed to compile.",
                     0x31);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        local_338._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_338 + 8),"Tessellation control shader failed to compile.",0x2e)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_338._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_338 + 8),"Geometry shader failed to compile.",0x22);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_338._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_338 + 8),"Fragment shader failed to compile.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_338 + 8));
  this_00 = (ios_base *)(local_328 + 0x68);
LAB_0093319d:
  std::ios_base::~ios_base(this_00);
  bVar4 = false;
LAB_009331a4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool GPUShaderFP64Test7::buildTestProgram(_variables& variables)
{
	std::string			  fs_body = getFragmentShaderBody(variables);
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	std::string			  gs_body = getGeometryShaderBody(variables);
	std::string			  tc_body = getTessellationControlShaderBody(variables);
	std::string			  te_body = getTessellationEvaluationShaderBody(variables);
	std::string			  vs_body = getVertexShaderBody(variables);
	bool				  result  = false;

	/* Try to link the program object */
	glw::GLint link_status = GL_FALSE;

	/* Compile the shaders */
	if (!compileShader(m_fs_id, fs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Fragment shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_gs_id, gs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Geometry shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_tc_id, tc_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation control shader failed to compile."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_te_id, te_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation evaluation shader failed to compile."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_vs_id, vs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	/* Configure XFB */
	releaseXFBVaryingNames();
	generateXFBVaryingNames(variables);

	gl.transformFeedbackVaryings(m_po_id, m_n_xfb_varyings, m_xfb_varyings, GL_INTERLEAVED_ATTRIBS);

	gl.linkProgram(m_po_id);

	/* Have we succeeded? */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Either glTransformFeedbackVaryings() or glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "A valid program object failed to link."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	/* Retrieve attribute locations *if* GL_ARB_vertex_attrib_64bit is supported */
	if (m_are_double_inputs_supported)
	{
		const size_t n_variables = variables.size();

		for (size_t n_variable = 0; n_variable < n_variables; ++n_variable)
		{
			_variable&		  current_variable = variables[n_variable];
			std::stringstream attribute_name_sstream;

			attribute_name_sstream << "in_vs_variable" << n_variable;

			if (current_variable.array_size > 1)
			{
				attribute_name_sstream << "[0]";
			}

			current_variable.attribute_location = gl.getAttribLocation(m_po_id, attribute_name_sstream.str().c_str());

			if (current_variable.attribute_location == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Input double-precision attribute named ["
								   << attribute_name_sstream.str().c_str()
								   << "] is considered inactive which is invalid." << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
				goto end;
			}
		} /* for (all test variables) */
	}	 /* if (m_are_double_inputs_supported) */

	m_current_fs_body = fs_body;
	m_current_gs_body = gs_body;
	m_current_tc_body = tc_body;
	m_current_te_body = te_body;
	m_current_vs_body = vs_body;

	result = true;

end:
	return result;
}